

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpTools.cpp
# Opt level: O1

void __thiscall UdpTools::UdpTools(UdpTools *this,string *iface)

{
  int iVar1;
  invalid_argument *this_00;
  UdpTools *this_01;
  _List_node_base *p_Var2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interfacesOnSystem;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  this->_vptr_UdpTools = (_func_int **)&PTR__UdpTools_00105d90;
  (this->specifiedInterface)._M_dataplus._M_p = (pointer)&(this->specifiedInterface).field_2;
  (this->specifiedInterface)._M_string_length = 0;
  (this->specifiedInterface).field_2._M_local_buf[0] = '\0';
  this->stopReceiveThread = false;
  this_01 = (UdpTools *)iface;
  std::__cxx11::string::_M_assign((string *)&this->specifiedInterface);
  getInterfaces_abi_cxx11_
            ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_40,this_01);
  p_Var2 = (_List_node_base *)&local_40;
  do {
    p_Var2 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&local_40) {
      printf("Given interface name %s was not found!\n",(iface->_M_dataplus)._M_p);
      printf("Detected interfaces: ");
      for (; local_40._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_40;
          local_40._M_impl._M_node.super__List_node_base._M_next =
               (((_List_impl *)&(local_40._M_impl._M_node.super__List_node_base._M_next)->_M_next)->
               _M_node).super__List_node_base._M_next) {
        printf("\t\t %s\n",*(size_t *)(local_40._M_impl._M_node.super__List_node_base._M_next + 1));
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Could not detect iface name");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar1 = std::__cxx11::string::compare((string *)(p_Var2 + 1));
  } while (iVar1 != 0);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_40);
  return;
}

Assistant:

UdpTools::UdpTools(std::string iface)
{
	stopReceiveThread = false;
	specifiedInterface = iface;
	std::list<std::string> interfacesOnSystem = getInterfaces();
	std::list<std::string>::iterator it;

	bool ifacefound = false;
	for(it = interfacesOnSystem.begin(); it != interfacesOnSystem.end(); it++)
	{
		if(it->compare(iface) == 0)
		{
			ifacefound = true;
			break;
		}
	}

	if(!ifacefound)
	{
		printf("Given interface name %s was not found!\n", iface.c_str());
		printf("Detected interfaces: ");
		for(it = interfacesOnSystem.begin(); it != interfacesOnSystem.end(); it++)
		{
			printf("\t\t %s\n", it->c_str());
		}
		throw std::invalid_argument("Could not detect iface name");
	}

}